

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pool.cpp
# Opt level: O2

void __thiscall TaskProviderSingleton::_run(TaskProviderSingleton *this,size_t taskCount)

{
  if ((taskCount != 0) && ((this->super_AbstractTaskProvider)._running == false)) {
    LOCK();
    (this->super_AbstractTaskProvider)._taskCount.super___atomic_base<unsigned_long>._M_i =
         taskCount;
    UNLOCK();
    LOCK();
    (this->super_AbstractTaskProvider)._givenTaskCount.super___atomic_base<unsigned_long>._M_i = 0;
    UNLOCK();
    LOCK();
    (this->super_AbstractTaskProvider)._completedTaskCount.super___atomic_base<unsigned_long>._M_i =
         0;
    UNLOCK();
    ThreadPoolMonoid::instance();
    ThreadPool::add(&ThreadPoolMonoid::instance::provider._pool,&this->super_AbstractTaskProvider,
                    (this->super_AbstractTaskProvider)._taskCount.super___atomic_base<unsigned_long>
                    ._M_i);
    return;
  }
  return;
}

Assistant:

void TaskProviderSingleton::_run( size_t taskCount )
{
    if( _ready() && taskCount > 0 ) {
        _taskCount          = taskCount;
        _givenTaskCount     = 0;
        _completedTaskCount = 0;

        ThreadPoolMonoid::instance().add( this, _taskCount );
    }
}